

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spxsolver.h
# Opt level: O3

SVectorBase<double> * __thiscall
soplex::SPxSolverBase<double>::vector(SPxSolverBase<double> *this,SPxRowId *rid)

{
  SVSetBase<double> *pSVar1;
  int iVar2;
  Item *pIVar3;
  
  if (this->theRep == ROW) {
    pSVar1 = this->thevectors;
    iVar2 = ClassSet<soplex::SVSetBase<double>::DLPSV>::number
                      (&(this->super_SPxLPBase<double>).super_LPRowSetBase<double>.
                        super_SVSetBase<double>.set,&rid->super_DataKey);
    pIVar3 = (pSVar1->set).theitem + (pSVar1->set).thekey[iVar2].idx;
  }
  else {
    iVar2 = ClassSet<soplex::SVSetBase<double>::DLPSV>::number
                      (&(this->super_SPxLPBase<double>).super_LPRowSetBase<double>.
                        super_SVSetBase<double>.set,&rid->super_DataKey);
    pIVar3 = (Item *)((this->unitVecs).data.
                      super__Vector_base<soplex::UnitVectorBase<double>,_std::allocator<soplex::UnitVectorBase<double>_>_>
                      ._M_impl.super__Vector_impl_data._M_start + iVar2);
  }
  return (SVectorBase<double> *)pIVar3;
}

Assistant:

const SVectorBase<R>& vector(const SPxRowId& rid) const
   {
      assert(rid.isValid());
      return (rep() == ROW)
             ? (*thevectors)[this->number(rid)]
             : static_cast<const SVectorBase<R>&>(unitVecs[this->number(rid)]);
   }